

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Testing2_640x480at60_25.175MHz.c
# Opt level: O1

void lastBlankingTime(void)

{
  int iVar1;
  
  iVar1 = 0x28;
  do {
    putchar(0xd);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  putchar(0xd);
  iVar1 = 6;
  do {
    putchar(9);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  iVar1 = 1;
  do {
    putchar(0xd);
    iVar1 = iVar1 + -1;
  } while (iVar1 == 0);
  putchar(0xc);
  return;
}

Assistant:

void lastBlankingTime() {

    // Blanking
    for(int i=0;i<(640/16);i++) {
        putchar(0b00001101);
    }

    // Front Porch
    for(int i=0; i<(16/16); i++) {
        putchar(0b00001101);
    }

    // hSync
    for(int i=0;i<(96/16);i++) {
        putchar(0b00001001);
    }

    // Back Porch
    for(int i=0; i<((48/16)-1); i++) {
        putchar(0b00001101);
    }

    // Counter Reset
    putchar(0b00001100);
}